

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_cvt.hpp
# Opt level: O1

void cvt_FMIns_to_OPNI(OPN2_Instrument *ins,OpnInstMeta *in)

{
  long lVar1;
  
  ins->percussion_key_number = in->drumTone;
  ins->inst_flags = in->flags;
  ins->fbalg = in->op[0].fbalg;
  ins->lfosens = in->op[0].lfosens;
  ins->note_offset = in->op[0].noteOffset;
  ins->midi_velocity_offset = in->midiVelocityOffset;
  lVar1 = 0;
  do {
    (&ins->operators[0].dtfm_30)[lVar1] = in->op[0].OPS[0].data[lVar1];
    (&ins->operators[0].level_40)[lVar1] = in->op[0].OPS[0].data[lVar1 + 1];
    (&ins->operators[0].rsatk_50)[lVar1] = in->op[0].OPS[0].data[lVar1 + 2];
    (&ins->operators[0].amdecay1_60)[lVar1] = in->op[0].OPS[0].data[lVar1 + 3];
    (&ins->operators[0].decay2_70)[lVar1] = in->op[0].OPS[0].data[lVar1 + 4];
    (&ins->operators[0].susrel_80)[lVar1] = in->op[0].OPS[0].data[lVar1 + 5];
    (&ins->operators[0].ssgeg_90)[lVar1] = in->op[0].OPS[0].data[lVar1 + 6];
    lVar1 = lVar1 + 7;
  } while (lVar1 != 0x1c);
  ins->delay_on_ms = in->soundKeyOnMs;
  ins->delay_off_ms = in->soundKeyOffMs;
  return;
}

Assistant:

static void cvt_FMIns_to_generic(WOPNI &ins, const OpnInstMeta &in)
{
    ins.percussion_key_number = in.drumTone;
    ins.inst_flags = in.flags;

    ins.fbalg = in.op[0].fbalg;
    ins.lfosens = in.op[0].lfosens;
    ins.note_offset = in.op[0].noteOffset;

    ins.midi_velocity_offset = in.midiVelocityOffset;

    for(size_t op = 0; op < 4; op++)
    {
        ins.operators[op].dtfm_30 = in.op[0].OPS[op].data[0];
        ins.operators[op].level_40 = in.op[0].OPS[op].data[1];
        ins.operators[op].rsatk_50 = in.op[0].OPS[op].data[2];
        ins.operators[op].amdecay1_60 = in.op[0].OPS[op].data[3];
        ins.operators[op].decay2_70 = in.op[0].OPS[op].data[4];
        ins.operators[op].susrel_80 = in.op[0].OPS[op].data[5];
        ins.operators[op].ssgeg_90 = in.op[0].OPS[op].data[6];
    }

    ins.delay_on_ms = in.soundKeyOnMs;
    ins.delay_off_ms = in.soundKeyOffMs;
}